

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256_leaf.cpp
# Opt level: O1

Node256Leaf * duckdb::Node256Leaf::GrowNode15Leaf(ART *art,Node *node256_leaf,Node *node15_leaf)

{
  byte bVar1;
  byte bVar2;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var3;
  idx_t iVar4;
  type paVar5;
  long *plVar6;
  pointer this;
  data_ptr_t pdVar7;
  Node256Leaf *pNVar8;
  __hash_code __code;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  
  uVar11 = (node15_leaf->super_IndexPointer).data;
  paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var3._M_head_impl =
       paVar5->_M_elems[7].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar9 = uVar11 & 0xffffffff;
  plVar6 = *(long **)(*(long *)&((_Var3._M_head_impl)->buffers)._M_h +
                     (uVar9 % *(size_type *)((long)&(_Var3._M_head_impl)->buffers + 8)) * 8);
  for (plVar10 = (long *)*plVar6; uVar9 != plVar10[1]; plVar10 = (long *)*plVar10) {
    plVar6 = plVar10;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar6 + 0x10));
  pdVar7 = FixedSizeBuffer::Get(this,true);
  lVar12 = (ulong)((uint)(uVar11 >> 0x20) & 0xffffff) * (_Var3._M_head_impl)->segment_size;
  iVar4 = (_Var3._M_head_impl)->bitmask_offset;
  pNVar8 = New(art,node256_leaf);
  (node256_leaf->super_IndexPointer).data =
       (node15_leaf->super_IndexPointer).data & 0x8000000000000000 |
       (node256_leaf->super_IndexPointer).data & 0x7fffffffffffffff;
  bVar1 = pdVar7[iVar4 + lVar12];
  pNVar8->count = (ushort)bVar1;
  if (bVar1 != 0) {
    uVar11 = 0;
    do {
      bVar2 = (pdVar7 + iVar4 + lVar12)[uVar11 + 1];
      pNVar8->mask[bVar2 >> 6] = pNVar8->mask[bVar2 >> 6] | 1L << (bVar2 & 0x3f);
      uVar11 = uVar11 + 1;
    } while (bVar1 != uVar11);
  }
  pdVar7[iVar4 + lVar12] = '\0';
  Node::Free(art,node15_leaf);
  return pNVar8;
}

Assistant:

Node256Leaf &Node256Leaf::GrowNode15Leaf(ART &art, Node &node256_leaf, Node &node15_leaf) {
	auto &n15 = Node::Ref<Node15Leaf>(art, node15_leaf, NType::NODE_15_LEAF);
	auto &n256 = New(art, node256_leaf);
	node256_leaf.SetGateStatus(node15_leaf.GetGateStatus());

	n256.count = n15.count;
	ValidityMask mask(&n256.mask[0], Node256::CAPACITY);
	for (uint8_t i = 0; i < n15.count; i++) {
		mask.SetValid(n15.key[i]);
	}

	n15.count = 0;
	Node::Free(art, node15_leaf);
	return n256;
}